

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall args::FlagBase::Validate(FlagBase *this,string *shortPrefix,string *longPrefix)

{
  int iVar1;
  ostream *poVar2;
  RequiredError *this_00;
  undefined1 auStack_1e8 [40];
  string local_1c0;
  ostringstream problem;
  
  iVar1 = (*(this->super_NamedBase).super_Base._vptr_Base[2])();
  if (((char)iVar1 == '\0') && (((this->super_NamedBase).super_Base.options & Required) != None)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&problem);
    poVar2 = std::operator<<((ostream *)&problem,"Flag \'");
    Matcher::GetLongOrAny((EitherFlag *)auStack_1e8,&this->matcher);
    EitherFlag::str(&local_1c0,(EitherFlag *)auStack_1e8,shortPrefix,longPrefix);
    poVar2 = std::operator<<(poVar2,(string *)&local_1c0);
    std::operator<<(poVar2,"\' is required");
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)(auStack_1e8 + 8));
    this_00 = (RequiredError *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    RequiredError::RequiredError(this_00,(string *)auStack_1e8);
    __cxa_throw(this_00,&RequiredError::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

virtual void Validate(const std::string &shortPrefix, const std::string &longPrefix) const override
            {
                if (!Matched() && IsRequired())
                {
                        std::ostringstream problem;
                        problem << "Flag '" << matcher.GetLongOrAny().str(shortPrefix, longPrefix) << "' is required";
#ifdef ARGS_NOEXCEPT
                        error = Error::Required;
                        errorMsg = problem.str();
#else
                        throw RequiredError(problem.str());
#endif
                }
            }